

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::EncryptionWithColumnKey::EncryptionWithColumnKey
          (EncryptionWithColumnKey *this,EncryptionWithColumnKey *other134)

{
  long in_RSI;
  TBase *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar1;
  string *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__EncryptionWithColumnKey_00c03040;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__EncryptionWithColumnKey_00c03040;
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)(in_RDI + 1);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x712870);
  this_00 = (string *)(in_RDI + 4);
  std::__cxx11::string::string(this_00);
  _EncryptionWithColumnKey__isset::_EncryptionWithColumnKey__isset
            ((_EncryptionWithColumnKey__isset *)(in_RDI + 8));
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)this_00,pvVar1);
  std::__cxx11::string::operator=((string *)(in_RDI + 4),(string *)(in_RSI + 0x20));
  *(undefined1 *)&in_RDI[8]._vptr_TBase = *(undefined1 *)(in_RSI + 0x40);
  return;
}

Assistant:

EncryptionWithColumnKey::EncryptionWithColumnKey(const EncryptionWithColumnKey& other134) {
  path_in_schema = other134.path_in_schema;
  key_metadata = other134.key_metadata;
  __isset = other134.__isset;
}